

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.cpp
# Opt level: O2

int mbedtls_md_hmac_starts(mbedtls_md_context_t *ctx,uchar *key,size_t keylen)

{
  uchar *__s;
  int iVar1;
  ulong uVar2;
  size_t __n;
  uchar *input;
  uchar sum [32];
  
  if (ctx == (mbedtls_md_context_t *)0x0) {
    return -0x5100;
  }
  if (ctx->md_info == (mbedtls_md_info_t *)0x0) {
    return -0x5100;
  }
  input = (uchar *)ctx->hmac_ctx;
  if (input == (uchar *)0x0) {
    return -0x5100;
  }
  __n = (size_t)ctx->md_info->block_size;
  if (__n < keylen) {
    iVar1 = mbedtls_md_starts(ctx);
    if (((iVar1 != 0) || (iVar1 = mbedtls_md_update(ctx,key,keylen), iVar1 != 0)) ||
       (iVar1 = mbedtls_md_finish(ctx,sum), iVar1 != 0)) goto LAB_01f236c0;
    input = (uchar *)ctx->hmac_ctx;
    keylen = (size_t)ctx->md_info->size;
    __n = (size_t)ctx->md_info->block_size;
    key = sum;
  }
  __s = input + __n;
  switchD_014c3389::default(input,0x36,__n);
  switchD_014c3389::default(__s,0x5c,(ulong)ctx->md_info->block_size);
  uVar2 = 0;
  while (uVar2 + 8 <= keylen) {
    *(ulong *)(input + uVar2) = *(ulong *)(input + uVar2) ^ *(ulong *)(key + uVar2);
    uVar2 = uVar2 + 8;
  }
  for (; uVar2 < keylen; uVar2 = uVar2 + 1) {
    input[uVar2] = input[uVar2] ^ key[uVar2];
  }
  uVar2 = 0;
  while (uVar2 + 8 <= keylen) {
    *(ulong *)(__s + uVar2) = *(ulong *)(__s + uVar2) ^ *(ulong *)(key + uVar2);
    uVar2 = uVar2 + 8;
  }
  for (; uVar2 < keylen; uVar2 = uVar2 + 1) {
    __s[uVar2] = __s[uVar2] ^ key[uVar2];
  }
  iVar1 = mbedtls_md_starts(ctx);
  if (iVar1 == 0) {
    iVar1 = mbedtls_md_update(ctx,input,(ulong)ctx->md_info->block_size);
  }
LAB_01f236c0:
  mbedtls_platform_zeroize(sum,0x20);
  return iVar1;
}

Assistant:

int mbedtls_md_hmac_starts(mbedtls_md_context_t *ctx, const unsigned char *key, size_t keylen)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char sum[MBEDTLS_MD_MAX_SIZE];
    unsigned char *ipad, *opad;

    if (ctx == NULL || ctx->md_info == NULL || ctx->hmac_ctx == NULL) {
        return MBEDTLS_ERR_MD_BAD_INPUT_DATA;
    }

    if (keylen > (size_t) ctx->md_info->block_size) {
        if ((ret = mbedtls_md_starts(ctx)) != 0) {
            goto cleanup;
        }
        if ((ret = mbedtls_md_update(ctx, key, keylen)) != 0) {
            goto cleanup;
        }
        if ((ret = mbedtls_md_finish(ctx, sum)) != 0) {
            goto cleanup;
        }

        keylen = ctx->md_info->size;
        key = sum;
    }

    ipad = (unsigned char *) ctx->hmac_ctx;
    opad = (unsigned char *) ctx->hmac_ctx + ctx->md_info->block_size;

    memset(ipad, 0x36, ctx->md_info->block_size);
    memset(opad, 0x5C, ctx->md_info->block_size);

    mbedtls_xor(ipad, ipad, key, keylen);
    mbedtls_xor(opad, opad, key, keylen);

    if ((ret = mbedtls_md_starts(ctx)) != 0) {
        goto cleanup;
    }
    if ((ret = mbedtls_md_update(ctx, ipad,
                                 ctx->md_info->block_size)) != 0) {
        goto cleanup;
    }

cleanup:
    mbedtls_platform_zeroize(sum, sizeof(sum));

    return ret;
}